

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightbuffer.cpp
# Opt level: O0

int __thiscall FLightBuffer::BindUBO(FLightBuffer *this,uint index)

{
  uint uVar1;
  uint offset;
  uint index_local;
  FLightBuffer *this_local;
  
  uVar1 = (index / this->mBlockAlign) * this->mBlockAlign;
  if (uVar1 != this->mLastMappedIndex) {
    this->mLastMappedIndex = uVar1;
    (*_ptrc_glBindBufferRange)
              (0x8a11,1,this->mBufferId,(long)uVar1 * 0x10,(GLsizeiptr)(this->mBlockSize << 4));
  }
  return index - uVar1;
}

Assistant:

int FLightBuffer::BindUBO(unsigned int index)
{
	unsigned int offset = (index / mBlockAlign) * mBlockAlign;

	if (offset != mLastMappedIndex)
	{
		// this will only get called if a uniform buffer is used. For a shader storage buffer we only need to bind the buffer once at the start to all shader programs
		mLastMappedIndex = offset;
		glBindBufferRange(GL_UNIFORM_BUFFER, LIGHTBUF_BINDINGPOINT, mBufferId, offset*16, mBlockSize*16);	// we go from counting vec4's to counting bytes here.
	}
	return (index - offset);
}